

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_dict_remove(void)

{
  int iVar1;
  VALUE *pVVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  VALUE d;
  char key [32];
  VALUE VStack_68;
  char local_58 [40];
  
  value_init_dict(&VStack_68);
  uVar5 = 0;
  do {
    sprintf(local_58,"%d",uVar5);
    pVVar2 = value_dict_get_or_add(&VStack_68,local_58);
    acutest_check_((uint)(pVVar2 != (VALUE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x363,"%s","v != NULL");
    value_init_int32(pVVar2,(int)uVar5);
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 100000);
  iVar1 = value_dict_verify(&VStack_68);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x366,"%s","value_dict_verify(&d) == 0");
  uVar4 = 0;
  do {
    sprintf(local_58,"%d",(ulong)uVar4);
    iVar1 = value_dict_remove(&VStack_68,local_58);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x36a,"%s","value_dict_remove(&d, key) == 0");
    uVar4 = uVar4 + 0x11;
  } while (uVar4 != 0x186ab);
  iVar1 = value_dict_remove(&VStack_68,"n/a");
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36d,"%s","value_dict_remove(&d, \"n/a\") != 0");
  sVar3 = value_dict_size(&VStack_68);
  acutest_check_((uint)(sVar3 == 0x16fa5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36f,"%s","value_dict_size(&d) == N - n_removed");
  uVar5 = 0;
  do {
    sprintf(local_58,"%d",uVar5);
    pVVar2 = value_dict_get(&VStack_68,local_58);
    if ((int)(uVar5 / 0x11) * 0x11 == (int)uVar5) {
      bVar7 = pVVar2 == (VALUE *)0x0;
      iVar1 = 0x375;
      pcVar6 = "v == NULL";
    }
    else {
      bVar7 = pVVar2 != (VALUE *)0x0;
      iVar1 = 0x377;
      pcVar6 = "v != NULL";
    }
    acutest_check_((uint)bVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,iVar1,"%s",pcVar6);
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 100000);
  value_dict_clean(&VStack_68);
  sVar3 = value_dict_size(&VStack_68);
  acutest_check_((uint)(sVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x37b,"%s","value_dict_size(&d) == 0");
  value_fini(&VStack_68);
  return;
}

Assistant:

static void
test_dict_remove(void)
{
    const int N = 100000;

    VALUE d;
    VALUE* v;
    int i;
    int n_removed = 0;
    char key[32];

    value_init_dict(&d);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get_or_add(&d, key);
        TEST_CHECK(v != NULL);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_dict_verify(&d) == 0);

    for(i = 0; i < N; i += 17) {
        sprintf(key, "%d", i);
        TEST_CHECK(value_dict_remove(&d, key) == 0);
        n_removed++;
    }
    TEST_CHECK(value_dict_remove(&d, "n/a") != 0);

    TEST_CHECK(value_dict_size(&d) == N - n_removed);

    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get(&d, key);
        if(i % 17 == 0)
            TEST_CHECK(v == NULL);
        else
            TEST_CHECK(v != NULL);
    }

    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);
}